

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>::copy
          (TypedAttribute<Imf_3_4::DeepImageState> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TypedAttribute<Imf_3_4::DeepImageState> *this_00;
  
  this_00 = (TypedAttribute<Imf_3_4::DeepImageState> *)operator_new(0x10);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  *(undefined8 *)&this_00->_value = 0;
  TypedAttribute(this_00);
  (*(this_00->super_Attribute)._vptr_Attribute[6])(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}